

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareBaseUnitsWithCapitalisation_Test::TestBody
          (Units_compareBaseUnitsWithCapitalisation_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_60;
  double local_58;
  long *local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40 [2];
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Units::create();
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"frufru","");
  libcellml::NamedEntity::setName(local_20);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  libcellml::Units::create();
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Frufru","");
  libcellml::NamedEntity::setName(local_30);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_60 = (long *)0x0;
  local_58 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_20,(shared_ptr *)&local_30,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_50,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)&local_60,&local_58);
  if (local_50._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x42e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_60 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, compareBaseUnitsWithCapitalisation)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("frufru");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("Frufru");

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}